

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  TestCase *pTVar1;
  TestInfo *pTVar2;
  bool bVar3;
  bool bVar4;
  pointer ppTVar5;
  pointer ppTVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  bool bVar10;
  string test_name;
  allocator local_a1;
  Int32 local_a0;
  Int32 local_9c;
  ulong local_98;
  ReactionToSharding local_90;
  int local_8c;
  UnitTestImpl *local_88;
  ulong local_80;
  TestCase *local_78;
  string local_70;
  string local_50;
  
  local_9c = -1;
  local_a0 = -1;
  local_88 = this;
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_a0 = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    local_9c = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  ppTVar5 = (local_88->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((local_88->test_cases_).
      super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
      super__Vector_impl_data._M_finish == ppTVar5) {
    iVar7 = 0;
  }
  else {
    local_98 = 0;
    iVar7 = 0;
    local_80 = 0;
    local_90 = shard_tests;
    do {
      pTVar1 = ppTVar5[local_80];
      std::__cxx11::string::string
                ((string *)&local_50,(pTVar1->name_)._M_dataplus._M_p,(allocator *)&local_70);
      pTVar1->should_run_ = false;
      ppTVar6 = (pTVar1->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((pTVar1->test_info_list_).
          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppTVar6) {
        uVar8 = 0;
        local_78 = pTVar1;
        do {
          pTVar2 = ppTVar6[uVar8];
          std::__cxx11::string::string
                    ((string *)&local_70,(pTVar2->name_)._M_dataplus._M_p,&local_a1);
          local_8c = iVar7;
          bVar3 = UnitTestOptions::MatchesFilter(&local_50,"DISABLED_*:*/DISABLED_*");
          bVar4 = true;
          if (!bVar3) {
            bVar4 = UnitTestOptions::MatchesFilter(&local_70,"DISABLED_*:*/DISABLED_*");
          }
          pTVar2->is_disabled_ = bVar4;
          bVar3 = UnitTestOptions::FilterMatchesTest(&local_50,&local_70);
          pTVar1 = local_78;
          pTVar2->matches_filter_ = bVar3;
          if (shard_tests == IGNORE_SHARDING_PROTOCOL) {
            bVar10 = false;
          }
          else {
            bVar10 = (int)((long)((ulong)(uint)((int)local_98 >> 0x1f) << 0x20 |
                                 local_98 & 0xffffffff) % (long)local_a0) != local_9c;
          }
          bVar9 = bVar3 & (bVar4 ^ 1U | FLAGS_gtest_also_run_disabled_tests);
          pTVar2->is_in_another_shard_ = bVar10;
          bVar3 = (bool)((bVar10 ^ 1U) & bVar9);
          pTVar2->should_run_ = bVar3;
          local_78->should_run_ = (bool)(local_78->should_run_ | bVar3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          local_98 = (ulong)((int)local_98 + (uint)bVar9);
          iVar7 = local_8c + (uint)bVar3;
          uVar8 = uVar8 + 1;
          ppTVar6 = (pTVar1->test_info_list_).
                    super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          shard_tests = local_90;
        } while (uVar8 < (ulong)((long)(pTVar1->test_info_list_).
                                       super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar6 >>
                                3));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      local_80 = local_80 + 1;
      ppTVar5 = (local_88->test_cases_).
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (local_80 <
             (ulong)((long)(local_88->test_cases_).
                           super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5 >> 3));
  }
  return iVar7;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const Int32 total_shards = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestTotalShards, -1) : -1;
  const Int32 shard_index = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestShardIndex, -1) : -1;

  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (size_t i = 0; i < test_cases_.size(); i++) {
    TestCase* const test_case = test_cases_[i];
    const std::string &test_case_name = test_case->name();
    test_case->set_should_run(false);

    for (size_t j = 0; j < test_case->test_info_list().size(); j++) {
      TestInfo* const test_info = test_case->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test case name or test name matches
      // kDisableTestFilter.
      const bool is_disabled =
          internal::UnitTestOptions::MatchesFilter(test_case_name,
                                                   kDisableTestFilter) ||
          internal::UnitTestOptions::MatchesFilter(test_name,
                                                   kDisableTestFilter);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter =
          internal::UnitTestOptions::FilterMatchesTest(test_case_name,
                                                       test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_case->set_should_run(test_case->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}